

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt * __thiscall slang::SVInt::operator^=(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  uint uVar2;
  ulong *puVar3;
  uint64_t *puVar4;
  byte bVar5;
  SVInt *pSVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  SVInt SStack_28;
  
  uVar7 = (this->super_SVIntStorage).bitWidth;
  uVar2 = (rhs->super_SVIntStorage).bitWidth;
  if (uVar7 != uVar2) {
    if (uVar2 <= uVar7) {
      extend(&SStack_28,(bitwidth_t)rhs,SUB41(uVar7,0));
      pSVar6 = operator^=(this,&SStack_28);
      ~SVInt(&SStack_28);
      return pSVar6;
    }
    extend(&SStack_28,(bitwidth_t)this,SUB41(uVar2,0));
    operator=(this,&SStack_28);
    ~SVInt(&SStack_28);
  }
  bVar5 = (this->super_SVIntStorage).unknownFlag;
  if (((bool)bVar5 == false) && ((rhs->super_SVIntStorage).unknownFlag == true)) {
    makeUnknown(this);
    bVar5 = (this->super_SVIntStorage).unknownFlag;
  }
  uVar7 = (this->super_SVIntStorage).bitWidth;
  if (uVar7 < 0x41 && (bVar5 & 1) == 0) {
    (this->super_SVIntStorage).field_0.val =
         (this->super_SVIntStorage).field_0.val ^ (rhs->super_SVIntStorage).field_0.val;
  }
  else {
    uVar7 = uVar7 + 0x3f >> 6;
    uVar8 = (ulong)uVar7;
    if ((bVar5 & 1) == 0) {
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        puVar3 = (this->super_SVIntStorage).field_0.pVal + uVar9;
        *puVar3 = *puVar3 ^ (rhs->super_SVIntStorage).field_0.pVal[uVar9];
      }
    }
    else {
      bVar1 = (rhs->super_SVIntStorage).unknownFlag;
      if ((rhs->super_SVIntStorage).bitWidth < 0x41 && (bVar1 & 1U) == 0) {
        puVar3 = (this->super_SVIntStorage).field_0.pVal;
        *puVar3 = ((rhs->super_SVIntStorage).field_0.val ^ *puVar3) & ~puVar3[1];
      }
      else {
        uVar9 = uVar8;
        if ((bVar1 & 1U) != 0) {
          while (uVar9 != 0) {
            puVar3 = (this->super_SVIntStorage).field_0.pVal + uVar8;
            *puVar3 = *puVar3 | (rhs->super_SVIntStorage).field_0.pVal[uVar8];
            uVar8 = uVar8 + 1;
            uVar9 = uVar9 - 1;
          }
        }
        uVar8 = (ulong)(uVar7 << 3);
        for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 8) {
          puVar4 = (this->super_SVIntStorage).field_0.pVal;
          *(ulong *)((long)puVar4 + uVar9) =
               (*(ulong *)((long)(rhs->super_SVIntStorage).field_0.pVal + uVar9) ^
               *(ulong *)((long)puVar4 + uVar9)) & ~*(ulong *)((long)puVar4 + uVar8 + uVar9);
        }
      }
    }
  }
  clearUnusedBits(this);
  return this;
}

Assistant:

SVInt& SVInt::operator^=(const SVInt& rhs) {
    if (bitWidth != rhs.bitWidth) {
        bool bothSigned = signFlag && rhs.signFlag;
        if (bitWidth < rhs.bitWidth)
            *this = extend(rhs.bitWidth, bothSigned);
        else
            return *this ^= rhs.extend(bitWidth, bothSigned);
    }

    if (!hasUnknown() && rhs.hasUnknown())
        makeUnknown();

    if (isSingleWord())
        val ^= rhs.val;
    else {
        uint32_t words = getNumWords(bitWidth, false);
        if (unknownFlag) {
            if (rhs.isSingleWord())
                pVal[0] = ~pVal[1] & (pVal[0] ^ rhs.val);
            else {
                if (rhs.hasUnknown()) {
                    for (uint32_t i = 0; i < words; i++)
                        pVal[i + words] |= rhs.pVal[i + words];
                }

                for (uint32_t i = 0; i < words; i++)
                    pVal[i] = ~pVal[i + words] & (pVal[i] ^ rhs.pVal[i]);
            }
        }
        else {
            for (uint32_t i = 0; i < words; i++)
                pVal[i] ^= rhs.pVal[i];
        }
    }
    clearUnusedBits();
    return *this;
}